

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O3

void __thiscall
duckdb::KeyValueSecretReader::KeyValueSecretReader
          (KeyValueSecretReader *this,DatabaseInstance *db_p,char **secret_types,
          idx_t secret_types_len,string *path_p)

{
  (this->secret_entry).internal.super___shared_ptr<duckdb::SecretEntry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->db).ptr = (DatabaseInstance *)0x0;
  (this->secret).ptr = (KeyValueSecret *)0x0;
  (this->secret_entry).internal.super___shared_ptr<duckdb::SecretEntry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->context).ptr = (ClientContext *)0x0;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  (this->db).ptr = db_p;
  ::std::__cxx11::string::operator=((string *)&this->path,(string *)path_p);
  Initialize(this,secret_types,secret_types_len);
  return;
}

Assistant:

KeyValueSecretReader::KeyValueSecretReader(DatabaseInstance &db_p, const char **secret_types, idx_t secret_types_len,
                                           string path_p) {
	db = db_p;
	path = std::move(path_p);
	Initialize(secret_types, secret_types_len);
}